

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O3

REF_STATUS ref_shard_prism_into_tet(REF_GRID ref_grid,REF_INT keeping_n_layers,REF_DICT of_faceid)

{
  size_t __size;
  int iVar1;
  REF_NODE ref_node;
  REF_CELL pRVar2;
  REF_ADJ pRVar3;
  undefined1 auVar4 [16];
  REF_GRID pRVar5;
  REF_STATUS RVar6;
  REF_BOOL RVar7;
  uint uVar8;
  int iVar9;
  REF_INT *vector;
  void *__s;
  int iVar10;
  long lVar11;
  undefined8 uVar12;
  REF_INT RVar13;
  char *pcVar14;
  REF_CELL pRVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  REF_INT tri_mark;
  REF_INT orig [27];
  REF_INT qua_nodes [27];
  REF_GLOB qua_global [27];
  REF_DICT local_298;
  uint local_290;
  int local_28c;
  REF_CELL local_288;
  long local_280;
  REF_CELL local_278;
  REF_CELL local_270;
  REF_CELL local_268;
  REF_GRID local_260;
  int local_258;
  int iStack_254;
  int iStack_250;
  undefined4 local_24c;
  int local_1e8;
  int iStack_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int iStack_1d4;
  int local_178 [4];
  undefined4 local_168;
  REF_CELL local_108;
  REF_DICT local_100;
  long local_f8;
  long local_f0;
  long lVar21;
  
  local_280 = CONCAT44(local_280._4_4_,keeping_n_layers);
  ref_node = ref_grid->node;
  uVar8 = ref_node->max;
  if ((long)(int)uVar8 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x3a9,
           "ref_shard_prism_into_tet","malloc mark of REF_INT negative");
    return 1;
  }
  pRVar2 = ref_grid->cell[10];
  local_268 = ref_grid->cell[8];
  local_288 = ref_grid->cell[9];
  local_278 = ref_grid->cell[6];
  local_270 = ref_grid->cell[3];
  __size = (long)(int)uVar8 * 4;
  vector = (REF_INT *)malloc(__size);
  auVar4 = _DAT_00221120;
  if (vector == (REF_INT *)0x0) {
    pcVar14 = "malloc mark of REF_INT NULL";
    uVar12 = 0x3a9;
LAB_001ef1bb:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar12,
           "ref_shard_prism_into_tet",pcVar14);
    uVar8 = 2;
  }
  else {
    local_260 = ref_grid;
    if (uVar8 == 0) {
      __s = malloc(__size);
      if (__s == (void *)0x0) goto LAB_001ef19a;
    }
    else {
      lVar11 = (ulong)uVar8 - 1;
      auVar19._8_4_ = (int)lVar11;
      auVar19._0_8_ = lVar11;
      auVar19._12_4_ = (int)((ulong)lVar11 >> 0x20);
      lVar11 = 0;
      auVar19 = auVar19 ^ _DAT_00221120;
      auVar20 = _DAT_00227510;
      auVar22 = _DAT_00221110;
      do {
        auVar23 = auVar22 ^ auVar4;
        iVar9 = auVar19._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar9 && auVar19._0_4_ < auVar23._0_4_ ||
                    iVar9 < auVar23._4_4_) & 1)) {
          *(undefined4 *)((long)vector + lVar11) = 0xffffffff;
        }
        if ((auVar23._12_4_ != auVar19._12_4_ || auVar23._8_4_ <= auVar19._8_4_) &&
            auVar23._12_4_ <= auVar19._12_4_) {
          *(undefined4 *)((long)vector + lVar11 + 4) = 0xffffffff;
        }
        auVar23 = auVar20 ^ auVar4;
        iVar16 = auVar23._4_4_;
        if (iVar16 <= iVar9 && (iVar16 != iVar9 || auVar23._0_4_ <= auVar19._0_4_)) {
          *(undefined4 *)((long)vector + lVar11 + 8) = 0xffffffff;
          *(undefined4 *)((long)vector + lVar11 + 0xc) = 0xffffffff;
        }
        lVar21 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + 4;
        auVar22._8_8_ = lVar21 + 4;
        lVar21 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 4;
        auVar20._8_8_ = lVar21 + 4;
        lVar11 = lVar11 + 0x10;
      } while ((ulong)(uVar8 + 3 >> 2) << 4 != lVar11);
      __s = malloc(__size);
      if (__s == (void *)0x0) {
LAB_001ef19a:
        pcVar14 = "malloc mark_copy of REF_INT NULL";
        uVar12 = 0x3aa;
        goto LAB_001ef1bb;
      }
      if (uVar8 != 0) {
        memset(__s,0xff,__size);
      }
    }
    pRVar15 = local_270;
    if ((of_faceid != (REF_DICT)0x0 && 0 < (int)local_280) && (0 < pRVar2->max)) {
      RVar13 = 0;
      do {
        RVar6 = ref_cell_nodes(pRVar2,RVar13,&local_1e8);
        if (RVar6 == 0) {
          local_258 = local_1e8;
          iStack_254 = iStack_1e4;
          iStack_250 = local_1e0;
          uVar8 = ref_cell_with(pRVar15,&local_258,&local_28c);
          if ((uVar8 != 0) && (uVar8 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x3b2,"ref_shard_prism_into_tet",(ulong)uVar8,"with");
            local_290 = uVar8;
          }
          if ((uVar8 != 5) && (uVar8 != 0)) {
            return local_290;
          }
          if (((long)local_28c != -1) &&
             (RVar7 = ref_dict_has_key(of_faceid,
                                       pRVar15->c2n[(long)pRVar15->size_per * (long)local_28c + 3]),
             RVar7 != 0)) {
            vector[local_258] = 0;
            vector[iStack_254] = 0;
            vector[iStack_250] = 0;
          }
          local_258 = local_1dc;
          iStack_254 = iStack_1d4;
          iStack_250 = local_1d8;
          uVar8 = ref_cell_with(pRVar15,&local_258,&local_28c);
          if ((uVar8 != 0) && (uVar8 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x3bd,"ref_shard_prism_into_tet",(ulong)uVar8,"with");
            local_290 = uVar8;
          }
          if ((uVar8 != 5) && (uVar8 != 0)) {
            return local_290;
          }
          if (((long)local_28c != -1) &&
             (RVar7 = ref_dict_has_key(of_faceid,
                                       pRVar15->c2n[(long)pRVar15->size_per * (long)local_28c + 3]),
             RVar7 != 0)) {
            vector[local_258] = 0;
            vector[iStack_254] = 0;
            vector[iStack_250] = 0;
          }
        }
        RVar13 = RVar13 + 1;
      } while (RVar13 < pRVar2->max);
    }
    uVar8 = ref_node_ghost_int(ref_node,vector,1);
    if (uVar8 == 0) {
      local_298 = of_faceid;
      if (0 < (int)local_280) {
        iVar9 = 0;
        do {
          local_298 = (REF_DICT)CONCAT44(local_298._4_4_,iVar9);
          if (0 < (long)ref_node->max) {
            memcpy(__s,vector,(long)ref_node->max << 2);
          }
          if (0 < pRVar2->max) {
            iVar16 = 0;
            do {
              RVar6 = ref_cell_nodes(pRVar2,iVar16,&local_1e8);
              if (RVar6 == 0) {
                lVar11 = (long)local_1e8;
                iVar1 = *(int *)((long)__s + lVar11 * 4);
                iVar10 = *(int *)((long)__s + (long)local_1dc * 4);
                if (iVar1 == -1) {
                  if (iVar10 != -1) goto LAB_001ef259;
                }
                else {
                  bVar18 = iVar10 == -1;
                  lVar11 = (long)local_1dc;
                  iVar10 = iVar1;
                  if (bVar18) {
LAB_001ef259:
                    vector[lVar11] = iVar10 + 1;
                  }
                }
                lVar11 = (long)iStack_1e4;
                iVar1 = *(int *)((long)__s + lVar11 * 4);
                iVar10 = *(int *)((long)__s + (long)local_1d8 * 4);
                if (iVar1 == -1) {
                  if (iVar10 != -1) goto LAB_001ef286;
                }
                else {
                  bVar18 = iVar10 == -1;
                  lVar11 = (long)local_1d8;
                  iVar10 = iVar1;
                  if (bVar18) {
LAB_001ef286:
                    vector[lVar11] = iVar10 + 1;
                  }
                }
                lVar11 = (long)local_1e0;
                iVar1 = *(int *)((long)__s + lVar11 * 4);
                iVar10 = *(int *)((long)__s + (long)iStack_1d4 * 4);
                if (iVar1 == -1) {
                  if (iVar10 != -1) goto LAB_001ef2b3;
                }
                else {
                  bVar18 = iVar10 == -1;
                  lVar11 = (long)iStack_1d4;
                  iVar10 = iVar1;
                  if (bVar18) {
LAB_001ef2b3:
                    vector[lVar11] = iVar10 + 1;
                  }
                }
              }
              iVar16 = iVar16 + 1;
            } while (iVar16 < pRVar2->max);
          }
          uVar8 = ref_node_ghost_int(ref_node,vector,1);
          if (uVar8 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x3db,"ref_shard_prism_into_tet",(ulong)uVar8,"update ghost mark");
            return uVar8;
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 != (int)local_280);
      }
      pRVar15 = local_278;
      if (0 < pRVar2->max) {
        RVar13 = 0;
        do {
          RVar6 = ref_cell_nodes(pRVar2,RVar13,&local_1e8);
          if ((RVar6 == 0) && ((vector[local_1e8] == -1 || (vector[local_1dc] == -1)))) {
            uVar8 = ref_cell_remove(pRVar2,RVar13);
            if (uVar8 != 0) {
              uVar17 = (ulong)uVar8;
              pcVar14 = "remove pri";
              uVar12 = 0x3e1;
              goto LAB_001ef8fd;
            }
            uVar8 = ref_shard_add_pri_as_tet(ref_node,local_268,&local_1e8,1);
            if (uVar8 != 0) {
              uVar17 = (ulong)uVar8;
              pcVar14 = "converts to tets";
              uVar12 = 0x3e3;
              goto LAB_001ef8fd;
            }
          }
          RVar13 = RVar13 + 1;
        } while (RVar13 < pRVar2->max);
      }
      if (0 < local_288->max) {
        RVar13 = 0;
        do {
          RVar6 = ref_cell_nodes(local_288,RVar13,&local_1e8);
          if ((RVar6 == 0) &&
             ((((vector[local_1e8] == -1 || (vector[iStack_1e4] == -1)) || (vector[local_1dc] == -1)
               ) || (vector[local_1d8] == -1)))) {
            uVar8 = ref_cell_remove(local_288,RVar13);
            if (uVar8 != 0) {
              uVar17 = (ulong)uVar8;
              pcVar14 = "remove qua";
              uVar12 = 0x3eb;
              goto LAB_001ef8fd;
            }
            uVar8 = ref_shard_add_pyr_as_tet(ref_node,local_268,&local_1e8,1);
            if (uVar8 != 0) {
              uVar17 = (ulong)uVar8;
              pcVar14 = "converts to tets";
              uVar12 = 0x3ed;
              goto LAB_001ef8fd;
            }
          }
          RVar13 = RVar13 + 1;
        } while (RVar13 < local_288->max);
      }
      if (0 < pRVar15->max) {
        iVar9 = 0;
        do {
          RVar6 = ref_cell_nodes(pRVar15,iVar9,local_178);
          if ((RVar6 == 0) &&
             (((vector[local_178[0]] == -1 || (vector[local_178[1]] == -1)) ||
              ((vector[local_178[2]] == -1 || (vector[local_178[3]] == -1)))))) {
            uVar8 = ref_cell_remove(pRVar15,iVar9);
            pRVar2 = local_270;
            if (uVar8 != 0) {
              uVar17 = (ulong)uVar8;
              pcVar14 = "remove qua";
              uVar12 = 0x3f5;
              goto LAB_001ef8fd;
            }
            local_24c = local_168;
            iVar16 = pRVar15->node_per;
            if (0 < (long)iVar16) {
              lVar11 = 0;
              do {
                iVar1 = local_178[lVar11];
                pRVar15 = (REF_CELL)0xffffffffffffffff;
                if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) &&
                   (pRVar15 = (REF_CELL)ref_node->global[iVar1], (long)pRVar15 < 0)) {
                  pRVar15 = (REF_CELL)0xffffffffffffffff;
                }
                (&local_108)[lVar11] = pRVar15;
                lVar11 = lVar11 + 1;
              } while (iVar16 != lVar11);
              local_288 = local_108;
              local_280 = local_f0;
              local_298 = local_100;
            }
            if (((long)local_288 < (long)local_298 && (long)local_288 < local_280) ||
               (local_f8 < local_280 && local_f8 < (long)local_298)) {
              local_258 = local_178[0];
              iStack_250 = local_178[3];
              uVar8 = ref_shard_cell_add_local(ref_node,local_270,&local_258);
              if (uVar8 != 0) {
                pcVar14 = "a tri";
                uVar12 = 0x404;
                goto LAB_001ef18b;
              }
              local_258 = local_178[0];
              iStack_250 = local_178[2];
              uVar8 = ref_shard_cell_add_local(ref_node,pRVar2,&local_258);
              pRVar15 = local_278;
              if (uVar8 != 0) {
                uVar17 = (ulong)uVar8;
                pcVar14 = "a tri";
                uVar12 = 0x408;
                goto LAB_001ef8fd;
              }
            }
            else {
              local_258 = local_178[0];
              iStack_250 = local_178[3];
              uVar8 = ref_shard_cell_add_local(ref_node,local_270,&local_258);
              if (uVar8 != 0) {
                pcVar14 = "a tri";
                uVar12 = 0x410;
                goto LAB_001ef18b;
              }
              local_258 = local_178[2];
              iStack_250 = local_178[1];
              uVar8 = ref_shard_cell_add_local(ref_node,pRVar2,&local_258);
              pRVar15 = local_278;
              if (uVar8 != 0) {
                uVar17 = (ulong)uVar8;
                pcVar14 = "a tri";
                uVar12 = 0x414;
                goto LAB_001ef8fd;
              }
            }
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < pRVar15->max);
      }
      free(__s);
      free(vector);
      pRVar5 = local_260;
      iVar9 = ref_node->max;
      if (iVar9 < 1) {
        uVar8 = 0;
      }
      else {
        lVar11 = 0;
        do {
          if ((((-1 < ref_node->global[lVar11]) &&
               ((pRVar3 = pRVar5->cell[8]->ref_adj, pRVar3->nnode <= lVar11 ||
                (pRVar3->first[lVar11] == -1)))) &&
              ((pRVar3 = pRVar5->cell[9]->ref_adj, pRVar3->nnode <= lVar11 ||
               (pRVar3->first[lVar11] == -1)))) &&
             (((pRVar3 = pRVar5->cell[10]->ref_adj, pRVar3->nnode <= lVar11 ||
               (pRVar3->first[lVar11] == -1)) &&
              ((pRVar3 = pRVar5->cell[0xb]->ref_adj, pRVar3->nnode <= lVar11 ||
               (pRVar3->first[lVar11] == -1)))))) {
            uVar8 = ref_node_remove_without_global(ref_node,(REF_INT)lVar11);
            if (uVar8 != 0) {
              uVar17 = (ulong)uVar8;
              pcVar14 = "hang node";
              uVar12 = 0x420;
LAB_001ef8fd:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,uVar12,"ref_shard_prism_into_tet",uVar17,pcVar14);
              return (REF_STATUS)uVar17;
            }
            iVar9 = ref_node->max;
          }
          lVar11 = lVar11 + 1;
          uVar8 = 0;
        } while (lVar11 < iVar9);
      }
    }
    else {
      pcVar14 = "update ghost mark";
      uVar12 = 0x3c6;
LAB_001ef18b:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
             uVar12,"ref_shard_prism_into_tet",(ulong)uVar8,pcVar14);
    }
  }
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_shard_prism_into_tet(REF_GRID ref_grid,
                                            REF_INT keeping_n_layers,
                                            REF_DICT of_faceid) {
  REF_INT cell, tri_mark;

  REF_INT orig[REF_CELL_MAX_SIZE_PER];
  REF_CELL pri = ref_grid_pri(ref_grid);
  REF_CELL pyr = ref_grid_pyr(ref_grid);
  REF_CELL tet = ref_grid_tet(ref_grid);

  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua_nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB qua_global[REF_CELL_MAX_SIZE_PER];
  REF_CELL qua = ref_grid_qua(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);

  REF_NODE ref_node = ref_grid_node(ref_grid);

  REF_INT relaxation;
  REF_INT node;
  REF_INT *mark, *mark_copy;

  ref_malloc_init(mark, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(mark_copy, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  /* mark nodes on prism tris */
  if (0 < keeping_n_layers && NULL != of_faceid)
    each_ref_cell_valid_cell_with_nodes(pri, cell, orig) {
      tri_nodes[0] = orig[0];
      tri_nodes[1] = orig[1];
      tri_nodes[2] = orig[2];
      RXS(ref_cell_with(tri, tri_nodes, &tri_mark), REF_NOT_FOUND, "with");
      if (REF_EMPTY != tri_mark) {
        if (ref_dict_has_key(of_faceid, ref_cell_c2n(tri, 3, tri_mark))) {
          mark[tri_nodes[0]] = 0;
          mark[tri_nodes[1]] = 0;
          mark[tri_nodes[2]] = 0;
        }
      }
      tri_nodes[0] = orig[3];
      tri_nodes[1] = orig[5];
      tri_nodes[2] = orig[4];
      RXS(ref_cell_with(tri, tri_nodes, &tri_mark), REF_NOT_FOUND, "with");
      if (REF_EMPTY != tri_mark) {
        if (ref_dict_has_key(of_faceid, ref_cell_c2n(tri, 3, tri_mark))) {
          mark[tri_nodes[0]] = 0;
          mark[tri_nodes[1]] = 0;
          mark[tri_nodes[2]] = 0;
        }
      }
    }
  RSS(ref_node_ghost_int(ref_node, mark, 1), "update ghost mark");

  for (relaxation = 0; relaxation < keeping_n_layers; relaxation++) {
    for (node = 0; node < ref_node_max(ref_node); node++)
      mark_copy[node] = mark[node];
    each_ref_cell_valid_cell_with_nodes(pri, cell, orig) {
      if (mark_copy[orig[0]] == REF_EMPTY && mark_copy[orig[3]] != REF_EMPTY)
        mark[orig[0]] = mark_copy[orig[3]] + 1;
      if (mark_copy[orig[3]] == REF_EMPTY && mark_copy[orig[0]] != REF_EMPTY)
        mark[orig[3]] = mark_copy[orig[0]] + 1;

      if (mark_copy[orig[1]] == REF_EMPTY && mark_copy[orig[4]] != REF_EMPTY)
        mark[orig[1]] = mark_copy[orig[4]] + 1;
      if (mark_copy[orig[4]] == REF_EMPTY && mark_copy[orig[1]] != REF_EMPTY)
        mark[orig[4]] = mark_copy[orig[1]] + 1;

      if (mark_copy[orig[2]] == REF_EMPTY && mark_copy[orig[5]] != REF_EMPTY)
        mark[orig[2]] = mark_copy[orig[5]] + 1;
      if (mark_copy[orig[5]] == REF_EMPTY && mark_copy[orig[2]] != REF_EMPTY)
        mark[orig[5]] = mark_copy[orig[2]] + 1;
    }
    RSS(ref_node_ghost_int(ref_node, mark, 1), "update ghost mark");
  }

  each_ref_cell_valid_cell_with_nodes(pri, cell, orig) {
    if (mark[orig[0]] != REF_EMPTY && mark[orig[3]] != REF_EMPTY) continue;

    RSS(ref_cell_remove(pri, cell), "remove pri");
    RSS(ref_shard_add_pri_as_tet(ref_node, tet, orig, REF_TRUE),
        "converts to tets");
  }

  each_ref_cell_valid_cell_with_nodes(pyr, cell, orig) {
    if (mark[orig[0]] != REF_EMPTY && mark[orig[1]] != REF_EMPTY &&
        mark[orig[3]] != REF_EMPTY && mark[orig[4]] != REF_EMPTY)
      continue;

    RSS(ref_cell_remove(pyr, cell), "remove qua");
    RSS(ref_shard_add_pyr_as_tet(ref_node, tet, orig, REF_TRUE),
        "converts to tets");
  }

  each_ref_cell_valid_cell_with_nodes(qua, cell, qua_nodes) {
    if (mark[qua_nodes[0]] != REF_EMPTY && mark[qua_nodes[1]] != REF_EMPTY &&
        mark[qua_nodes[2]] != REF_EMPTY && mark[qua_nodes[3]] != REF_EMPTY)
      continue;

    RSS(ref_cell_remove(qua, cell), "remove qua");
    tri_nodes[3] = qua_nodes[4]; /* patch id */

    for (node = 0; node < ref_cell_node_per(qua); node++)
      qua_global[node] = ref_node_global(ref_node, qua_nodes[node]);

    if ((qua_global[0] < qua_global[1] && qua_global[0] < qua_global[3]) ||
        (qua_global[2] < qua_global[1] &&
         qua_global[2] < qua_global[3])) { /* 0-2 diag split of quad */
                                           /* 2-1
                                              |\|
                                              3-0 */
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[2];
      tri_nodes[2] = qua_nodes[3];
      RSS(ref_shard_cell_add_local(ref_node, tri, tri_nodes), "a tri");
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[1];
      tri_nodes[2] = qua_nodes[2];
      RSS(ref_shard_cell_add_local(ref_node, tri, tri_nodes), "a tri");
    } else { /* 3-1 diag split of quad */
             /* 2-1
                |/|
                3-0 */
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[1];
      tri_nodes[2] = qua_nodes[3];
      RSS(ref_shard_cell_add_local(ref_node, tri, tri_nodes), "a tri");
      tri_nodes[0] = qua_nodes[2];
      tri_nodes[1] = qua_nodes[3];
      tri_nodes[2] = qua_nodes[1];
      RSS(ref_shard_cell_add_local(ref_node, tri, tri_nodes), "a tri");
    }
  }

  ref_free(mark_copy);
  ref_free(mark);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_empty(ref_cell_adj(ref_grid_tet(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pyr(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pri(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_hex(ref_grid)), node)) {
      RSS(ref_node_remove_without_global(ref_node, node), "hang node");
    }
  }

  return REF_SUCCESS;
}